

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O2

vector_s<unsigned_int,_10UL> * __thiscall
estl::vector_s<unsigned_int,10ul>::operator=
          (vector_s<unsigned_int,10ul> *this,vector_s<unsigned_int,_9UL> *other)

{
  size_type sVar1;
  pointer pvVar2;
  long lVar3;
  size_type sVar4;
  bool bVar5;
  
  if ((vector_s<unsigned_int,_9UL> *)this != other) {
    sVar1 = other->size_;
    pvVar2 = other->data_ptr_;
    lVar3 = *(long *)(this + 0x30);
    sVar4 = sVar1;
    while (bVar5 = sVar4 != 0, sVar4 = sVar4 - 1, bVar5) {
      *(value_type_conflict *)(lVar3 + sVar4 * 4) = pvVar2[sVar4];
    }
    *(size_type *)this = sVar1;
  }
  return (vector_s<unsigned_int,_10UL> *)this;
}

Assistant:

vector_s& operator=(const vector_s<T, CAPACITY_OTHER>& other)
    {
        // NOTE: The reinterpret cast is needed as the pointer types can potentially
        //       be different if the capacities of the vectors are different.
        //       As we merely need to check the pointer adresses it's ok with
        //       with this "crude" cast here!
        if (reinterpret_cast<void*>(this) != reinterpret_cast<const void*>(&other)) // prevent self-assignment
        {
            for (size_type i = other.size(); i > 0; ) {
                --i;
                const pointer insert_ptr = data_ptr_ + i;
                new (insert_ptr) value_type(other[i]);
            }
            size_ = other.size();
        }
        return *this;
    }